

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cv_wait_example_test.c
# Opt level: O0

void string_priority_queue_cv_add(string_priority_queue_cv *q,char *s)

{
  char **ppcVar1;
  int iVar2;
  bool bVar3;
  int local_28;
  int j_;
  int n_;
  int i_;
  int alen;
  char *s_local;
  string_priority_queue_cv *q_local;
  
  nsync::nsync_mu_lock(&q->mu);
  j_ = (q->heap).h_.len_;
  if (j_ == 0) {
    nsync::nsync_cv_broadcast(&q->non_empty);
  }
  a_ensure_(&q->heap,1,8);
  ppcVar1 = (q->heap).a_;
  iVar2 = (q->heap).h_.len_;
  (q->heap).h_.len_ = iVar2 + 1;
  ppcVar1[iVar2] = s;
  while( true ) {
    bVar3 = false;
    if (j_ != 0) {
      local_28 = j_ + -1 >> 1;
      iVar2 = str_lt(s,(q->heap).a_[local_28]);
      bVar3 = iVar2 != 0;
    }
    if (!bVar3) break;
    (q->heap).a_[j_] = (q->heap).a_[local_28];
    no_set((q->heap).a_[j_],j_);
    j_ = local_28;
  }
  (q->heap).a_[j_] = s;
  no_set((q->heap).a_[j_],j_);
  nsync::nsync_mu_unlock(&q->mu);
  return;
}

Assistant:

static void string_priority_queue_cv_add (string_priority_queue_cv *q, const char *s) {
	int alen;
	nsync_mu_lock (&q->mu);
	alen = A_LEN (&q->heap);
	if (alen == 0) {
		nsync_cv_broadcast (&q->non_empty);
	}
	A_PUSH (&q->heap) = s;
	heap_add (&A (&q->heap, 0), alen, str_lt, no_set, s);
	nsync_mu_unlock (&q->mu);
}